

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O0

amqp_rpc_reply_t *
amqp_publisher_confirm_wait
          (amqp_connection_state_t state,timeval *timeout,amqp_publisher_confirm_t *result)

{
  int iVar1;
  undefined8 *in_RCX;
  amqp_connection_state_t in_RDI;
  amqp_frame_t frame;
  int res;
  amqp_connection_state_t state_00;
  char in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb1;
  undefined2 in_stack_ffffffffffffffb2;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 *local_40;
  
  state_00 = in_RDI;
  memset(in_RDI,0,0x20);
  memset(in_RCX,0,0x18);
  iVar1 = amqp_simple_wait_frame_noblock
                    ((amqp_connection_state_t)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (amqp_frame_t *)
                     CONCAT44(in_stack_ffffffffffffffb4,
                              CONCAT22(in_stack_ffffffffffffffb2,
                                       CONCAT11(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0)
                                      )),(timeval *)state_00);
  if (iVar1 == 0) {
    if ((in_stack_ffffffffffffffb0 == '\x01') &&
       (((in_stack_ffffffffffffffb8 == 0x3c0050 || (in_stack_ffffffffffffffb8 == 0x3c0078)) ||
        (in_stack_ffffffffffffffb8 == 0x3c005a)))) {
      if (in_stack_ffffffffffffffb8 == 0x3c0050) {
        *in_RCX = *local_40;
        in_RCX[1] = local_40[1];
      }
      else if (in_stack_ffffffffffffffb8 == 0x3c005a) {
        *in_RCX = *local_40;
        in_RCX[1] = local_40[1];
      }
      else {
        if (in_stack_ffffffffffffffb8 != 0x3c0078) {
          amqp_put_back_frame(state_00,(amqp_frame_t *)in_RDI);
          *(undefined4 *)in_RDI->pool_table = 2;
          *(undefined4 *)(in_RDI->pool_table + 3) = 0xffffffec;
          return (amqp_rpc_reply_t *)state_00;
        }
        *in_RCX = *local_40;
        in_RCX[1] = local_40[1];
      }
      *(int *)((long)in_RCX + 0x14) = in_stack_ffffffffffffffb8;
      *(undefined2 *)(in_RCX + 2) = in_stack_ffffffffffffffb2;
      *(undefined4 *)in_RDI->pool_table = 1;
    }
    else {
      amqp_put_back_frame(state_00,(amqp_frame_t *)in_RDI);
      *(undefined4 *)in_RDI->pool_table = 2;
      *(undefined4 *)(in_RDI->pool_table + 3) = 0xfffffff0;
    }
  }
  else {
    *(undefined4 *)in_RDI->pool_table = 2;
    *(int *)(in_RDI->pool_table + 3) = iVar1;
  }
  return (amqp_rpc_reply_t *)state_00;
}

Assistant:

amqp_rpc_reply_t amqp_publisher_confirm_wait(amqp_connection_state_t state,
                                             const struct timeval *timeout,
                                             amqp_publisher_confirm_t *result) {
  int res;
  amqp_frame_t frame;
  amqp_rpc_reply_t ret;

  memset(&ret, 0x0, sizeof(ret));
  memset(result, 0x0, sizeof(amqp_publisher_confirm_t));

  res = amqp_simple_wait_frame_noblock(state, &frame, timeout);

  if (AMQP_STATUS_OK != res) {
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = res;
    return ret;
  } else if (AMQP_FRAME_METHOD != frame.frame_type ||
             (AMQP_BASIC_ACK_METHOD != frame.payload.method.id &&
              AMQP_BASIC_NACK_METHOD != frame.payload.method.id &&
              AMQP_BASIC_REJECT_METHOD != frame.payload.method.id)) {
    amqp_put_back_frame(state, &frame);
    ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    ret.library_error = AMQP_STATUS_UNEXPECTED_STATE;
    return ret;
  }

  switch (frame.payload.method.id) {
    case AMQP_BASIC_ACK_METHOD:
      memcpy(&(result->payload.ack), frame.payload.method.decoded,
             sizeof(amqp_basic_ack_t));
      break;

    case AMQP_BASIC_NACK_METHOD:
      memcpy(&(result->payload.nack), frame.payload.method.decoded,
             sizeof(amqp_basic_nack_t));
      break;

    case AMQP_BASIC_REJECT_METHOD:
      memcpy(&(result->payload.reject), frame.payload.method.decoded,
             sizeof(amqp_basic_reject_t));
      break;

    default:
      amqp_put_back_frame(state, &frame);
      ret.reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
      ret.library_error = AMQP_STATUS_UNSUPPORTED;
      return ret;
  }
  result->method = frame.payload.method.id;
  result->channel = frame.channel;
  ret.reply_type = AMQP_RESPONSE_NORMAL;

  return ret;
}